

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qpauseanimation.cpp
# Opt level: O1

void QPauseAnimation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  long *plVar2;
  int iVar3;
  
  if (_c == WriteProperty) {
    if (_id == 0) {
      setDuration((QPauseAnimation *)_o,**_a);
    }
  }
  else if ((_c == ReadProperty) && (_id == 0)) {
    piVar1 = (int *)*_a;
    iVar3 = (*_o->_vptr_QObject[0xc])(_o);
    *piVar1 = iVar3;
  }
  if (_c == BindableProperty && _id == 0) {
    plVar2 = (long *)*_a;
    *plVar2 = (long)((_o->d_ptr).d + 2);
    plVar2[1] = (long)&QtPrivate::
                       QBindableInterfaceForProperty<QObjectCompatProperty<QPauseAnimationPrivate,_int,_&QPauseAnimationPrivate::_qt_property_duration_offset,_&QPauseAnimationPrivate::setDuration,_nullptr,_nullptr>,_void>
                       ::iface;
  }
  return;
}

Assistant:

void QPauseAnimation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPauseAnimation *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->duration(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDuration(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDuration(); break;
        default: break;
        }
    }
}